

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VM.cpp
# Opt level: O2

void __thiscall luna::VM::CopyVarArg(VM *this,Value *a,Instruction i)

{
  undefined8 *puVar1;
  State *pSVar2;
  Closure *this_00;
  _List_node_base *p_Var3;
  _List_node_base **pp_Var4;
  int iVar5;
  Function *this_01;
  _List_node_base *p_Var6;
  uint uVar7;
  undefined8 *puVar8;
  ulong uVar9;
  char *__assertion;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  
  pSVar2 = this->state_;
  if ((pSVar2->calls_).super__List_base<luna::CallInfo,_std::allocator<luna::CallInfo>_>._M_impl.
      _M_node.super__List_node_base._M_next == (_List_node_base *)&pSVar2->calls_) {
    __assertion = "!state_->calls_.empty()";
  }
  else {
    p_Var6 = (pSVar2->calls_).super__List_base<luna::CallInfo,_std::allocator<luna::CallInfo>_>.
             _M_impl._M_node.super__List_node_base._M_prev;
    if ((p_Var6[1]._M_prev != (_List_node_base *)0x0) &&
       (this_00 = (Closure *)(p_Var6[1]._M_prev)->_M_next, this_00 != (Closure *)0x0)) {
      this_01 = Closure::GetPrototype(this_00);
      p_Var3 = p_Var6[1]._M_next;
      p_Var6 = p_Var6[1]._M_prev;
      iVar5 = Function::FixedArgCount(this_01);
      uVar10 = (int)((ulong)((long)p_Var3 - (long)(p_Var6 + 1)) >> 4) - iVar5;
      iVar5 = Function::FixedArgCount(this_01);
      p_Var6 = p_Var6 + (long)iVar5 + 1;
      if ((i.opcode_ & 0xffff) == 0xffff) {
        uVar7 = 0;
        if (0 < (int)uVar10) {
          uVar7 = uVar10;
        }
        while (bVar12 = uVar7 != 0, uVar7 = uVar7 - 1, bVar12) {
          a->type_ = *(ValueT *)&p_Var6->_M_prev;
          pp_Var4 = &p_Var6->_M_next;
          p_Var6 = p_Var6 + 1;
          a->field_0 = (anon_union_8_9_8deb4486_for_Value_0)*pp_Var4;
          a = a + 1;
        }
        Stack::SetNewTop(&this->state_->stack_,a);
        return;
      }
      uVar7 = (uint)(short)i.opcode_;
      if ((int)uVar7 <= (int)uVar10) {
        uVar10 = uVar7;
      }
      uVar9 = 0;
      uVar11 = (ulong)uVar10;
      if ((int)uVar10 < 1) {
        uVar11 = uVar9;
      }
      for (; puVar8 = (undefined8 *)((long)&a->field_0 + uVar9), (int)(uVar11 << 4) != (int)uVar9;
          uVar9 = uVar9 + 0x10) {
        puVar1 = (undefined8 *)((long)&p_Var6->_M_next + uVar9);
        *(undefined4 *)(puVar8 + 1) = *(undefined4 *)(puVar1 + 1);
        *puVar8 = *puVar1;
      }
      for (; (int)uVar11 < (int)uVar7; uVar11 = (ulong)((int)uVar11 + 1)) {
        *puVar8 = 0;
        *(undefined4 *)(puVar8 + 1) = 0;
        puVar8 = puVar8 + 2;
      }
      return;
    }
    __assertion = "call->func_ && call->func_->closure_";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/VM.cpp",
                0x17b,"void luna::VM::CopyVarArg(Value *, Instruction)");
}

Assistant:

void VM::CopyVarArg(Value *a, Instruction i)
    {
        GET_CALLINFO_AND_PROTO();
        auto arg = call->func_ + 1;
        int total_args = call->register_ - arg;
        int vararg_count = total_args - proto->FixedArgCount();

        arg += proto->FixedArgCount();
        int expect_count = Instruction::GetParamsBx(i);
        if (expect_count == EXP_VALUE_COUNT_ANY)
        {
            for (int i = 0; i < vararg_count; ++i)
                *a++ = *arg++;
            state_->stack_.SetNewTop(a);
        }
        else
        {
            int i = 0;
            for (; i < vararg_count && i < expect_count; ++i)
                *a++ = *arg++;
            for (; i < expect_count; ++i, ++a)
                a->SetNil();
        }
    }